

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiConfigurable.cpp
# Opt level: O0

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Analyser::Dynamic::MultiConfigurable::get_options(MultiConfigurable *this)

{
  MultiConfigurable *this_local;
  
  this_local = this;
  std::
  make_unique<(anonymous_namespace)::MultiStruct,std::vector<Configurable::Device*,std::allocator<Configurable::Device*>>&>
            ((vector<Configurable::Device_*,_std::allocator<Configurable::Device_*>_> *)
             &stack0xffffffffffffffe0);
  std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>::
  unique_ptr<(anonymous_namespace)::MultiStruct,std::default_delete<(anonymous_namespace)::MultiStruct>,void>
            ((unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>> *)this,
             (unique_ptr<(anonymous_namespace)::MultiStruct,_std::default_delete<(anonymous_namespace)::MultiStruct>_>
              *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<(anonymous_namespace)::MultiStruct,_std::default_delete<(anonymous_namespace)::MultiStruct>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultiStruct,_std::default_delete<(anonymous_namespace)::MultiStruct>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> MultiConfigurable::get_options() {
	return std::make_unique<MultiStruct>(devices_);
}